

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O1

int markpara(int f,int n)

{
  mgwin *pmVar1;
  int iVar2;
  int local_1c [2];
  int i;
  
  local_1c[0] = 0;
  if (n != 0) {
    clearmark(7,0);
    iVar2 = findpara();
    if (iVar2 != 0) {
      do_gotoeop(8,n,local_1c);
      pmVar1 = curwp;
      curwp->w_markp = curwp->w_dotp;
      pmVar1->w_marko = pmVar1->w_doto;
      gotobop(8,local_1c[0]);
    }
  }
  return 1;
}

Assistant:

int
markpara(int f, int n)
{
	int i = 0;

	if (n == 0)
		return (TRUE);

	clearmark(FFARG, 0);

	if (findpara() == FALSE)
		return (TRUE);

	(void)do_gotoeop(FFRAND, n, &i);

	/* set the mark here */
	curwp->w_markp = curwp->w_dotp;
	curwp->w_marko = curwp->w_doto;

	(void)gotobop(FFRAND, i);

	return (TRUE);
}